

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm2_sig.c
# Opt level: O0

int sm2sig_digest_signverify_init(void *vpsm2ctx,char *mdname,void *ec,OSSL_PARAM *params)

{
  int iVar1;
  EVP_MD_CTX *pEVar2;
  uchar *puVar3;
  long in_RDI;
  int ret;
  WPACKET pkt;
  int md_nid;
  PROV_SM2_CTX_conflict *ctx;
  uint in_stack_ffffffffffffff88;
  EVP_MD_CTX *in_stack_ffffffffffffff90;
  WPACKET *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa4;
  EC_KEY *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  WPACKET *in_stack_ffffffffffffffb8;
  int local_4;
  
  local_4 = 0;
  iVar1 = sm2sig_signature_init
                    (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                     (OSSL_PARAM *)(ulong)in_stack_ffffffffffffff88);
  if ((iVar1 != 0) &&
     (iVar1 = sm2sig_set_mdname((PROV_SM2_CTX_conflict *)CONCAT44(local_4,in_stack_ffffffffffffff88)
                                ,(char *)0x34afc2), iVar1 != 0)) {
    if (*(long *)(in_RDI + 0x168) == 0) {
      pEVar2 = EVP_MD_CTX_new();
      *(EVP_MD_CTX **)(in_RDI + 0x168) = pEVar2;
      if (*(long *)(in_RDI + 0x168) == 0) {
        return local_4;
      }
    }
    EVP_MD_get_type(*(EVP_MD **)(in_RDI + 0x160));
    *(undefined8 *)(in_RDI + 0x158) = 0;
    iVar1 = WPACKET_init_der(in_stack_ffffffffffffff98,(uchar *)in_stack_ffffffffffffff90,
                             CONCAT44(local_4,in_stack_ffffffffffffff88));
    if (((iVar1 != 0) &&
        (iVar1 = ossl_DER_w_algorithmIdentifier_SM2_with_MD
                           (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                            in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4), iVar1 != 0)) &&
       (iVar1 = WPACKET_finish((WPACKET *)CONCAT44(local_4,in_stack_ffffffffffffff88)), iVar1 != 0))
    {
      WPACKET_get_total_written((WPACKET *)&stack0xffffffffffffff90,(size_t *)(in_RDI + 0x158));
      puVar3 = WPACKET_get_curr((WPACKET *)&stack0xffffffffffffff90);
      *(uchar **)(in_RDI + 0x150) = puVar3;
    }
    WPACKET_cleanup((WPACKET *)in_stack_ffffffffffffff90);
    iVar1 = EVP_DigestInit_ex2(in_stack_ffffffffffffff90,
                               (EVP_MD *)CONCAT44(local_4,in_stack_ffffffffffffff88),
                               (OSSL_PARAM *)0x34b0da);
    if (iVar1 != 0) {
      *(byte *)(in_RDI + 0x18) = *(byte *)(in_RDI + 0x18) & 0xfe | 1;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int sm2sig_digest_signverify_init(void *vpsm2ctx, const char *mdname,
                                         void *ec, const OSSL_PARAM params[])
{
    PROV_SM2_CTX *ctx = (PROV_SM2_CTX *)vpsm2ctx;
    int md_nid;
    WPACKET pkt;
    int ret = 0;

    if (!sm2sig_signature_init(vpsm2ctx, ec, params)
        || !sm2sig_set_mdname(ctx, mdname))
        return ret;

    if (ctx->mdctx == NULL) {
        ctx->mdctx = EVP_MD_CTX_new();
        if (ctx->mdctx == NULL)
            goto error;
    }

    md_nid = EVP_MD_get_type(ctx->md);

    /*
     * We do not care about DER writing errors.
     * All it really means is that for some reason, there's no
     * AlgorithmIdentifier to be had, but the operation itself is
     * still valid, just as long as it's not used to construct
     * anything that needs an AlgorithmIdentifier.
     */
    ctx->aid_len = 0;
    if (WPACKET_init_der(&pkt, ctx->aid_buf, sizeof(ctx->aid_buf))
        && ossl_DER_w_algorithmIdentifier_SM2_with_MD(&pkt, -1, ctx->ec, md_nid)
        && WPACKET_finish(&pkt)) {
        WPACKET_get_total_written(&pkt, &ctx->aid_len);
        ctx->aid = WPACKET_get_curr(&pkt);
    }
    WPACKET_cleanup(&pkt);

    if (!EVP_DigestInit_ex2(ctx->mdctx, ctx->md, params))
        goto error;

    ctx->flag_compute_z_digest = 1;

    ret = 1;

 error:
    return ret;
}